

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleVariableTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_2::SampleIDCase::init(SampleIDCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  MessageBuilder local_190;
  
  if (this->m_vericationMode == VERIFY_USING_SELECTION) {
    local_190.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_190.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Selecting a single sample id for each pixel and writing color only if gl_SampleID == selected.\n"
                   );
    std::operator<<((ostream *)poVar1,
                    "Expecting all output pixels to be partially (multisample) or fully (singlesample) colored.\n"
                   );
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (this->m_vericationMode != VERIFY_USING_SAMPLES) goto LAB_004317a3;
    local_190.m_log =
         ((this->super_MultisampleRenderCase).super_MultisampleRenderCase.super_TestCase.
          super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = &local_190.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,
                    "Writing gl_SampleID to the green channel of the texture and verifying texture values, expecting:\n"
                   );
    std::operator<<((ostream *)poVar1,"\t1) 0 with non-multisample targets.\n");
    std::operator<<((ostream *)poVar1,"\t2) value N at sample index N of a multisample texture\n");
    ctx = (EVP_PKEY_CTX *)&tcu::TestLog::EndMessage;
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190.m_str);
LAB_004317a3:
  iVar2 = MultisampleRenderCase::init(&this->super_MultisampleRenderCase,ctx);
  return iVar2;
}

Assistant:

void SampleIDCase::init (void)
{
	// log the test method and expectations
	if (m_vericationMode == VERIFY_USING_SAMPLES)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Writing gl_SampleID to the green channel of the texture and verifying texture values, expecting:\n"
			<< "	1) 0 with non-multisample targets.\n"
			<< "	2) value N at sample index N of a multisample texture\n"
			<< tcu::TestLog::EndMessage;
	else if (m_vericationMode == VERIFY_USING_SELECTION)
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Selecting a single sample id for each pixel and writing color only if gl_SampleID == selected.\n"
			<< "Expecting all output pixels to be partially (multisample) or fully (singlesample) colored.\n"
			<< tcu::TestLog::EndMessage;
	else
		DE_ASSERT(false);

	MultisampleRenderCase::init();
}